

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_table_info.cpp
# Opt level: O2

void duckdb::PragmaTableInfoHelper::GetTableColumns
               (ColumnDefinition *column,ColumnConstraintInfo constraint_info,DataChunk *output,
               idx_t index)

{
  column_t *pcVar1;
  string *psVar2;
  LogicalType *this;
  Value VStack_a8;
  string local_68;
  string local_48;
  
  pcVar1 = ColumnDefinition::Oid(column);
  Value::INTEGER(&VStack_a8,(int32_t)*pcVar1);
  DataChunk::SetValue(output,0,index,&VStack_a8);
  Value::~Value(&VStack_a8);
  psVar2 = ColumnDefinition::Name_abi_cxx11_(column);
  ::std::__cxx11::string::string((string *)&local_48,(string *)psVar2);
  Value::Value(&VStack_a8,&local_48);
  DataChunk::SetValue(output,1,index,&VStack_a8);
  Value::~Value(&VStack_a8);
  ::std::__cxx11::string::~string((string *)&local_48);
  this = ColumnDefinition::Type(column);
  LogicalType::ToString_abi_cxx11_(&local_68,this);
  Value::Value(&VStack_a8,&local_68);
  DataChunk::SetValue(output,2,index,&VStack_a8);
  Value::~Value(&VStack_a8);
  ::std::__cxx11::string::~string((string *)&local_68);
  Value::BOOLEAN(&VStack_a8,(bool)(constraint_info.not_null & 1));
  DataChunk::SetValue(output,3,index,&VStack_a8);
  Value::~Value(&VStack_a8);
  DefaultValue(&VStack_a8,column);
  DataChunk::SetValue(output,4,index,&VStack_a8);
  Value::~Value(&VStack_a8);
  Value::BOOLEAN(&VStack_a8,(bool)(constraint_info.pk & 1));
  DataChunk::SetValue(output,5,index,&VStack_a8);
  Value::~Value(&VStack_a8);
  return;
}

Assistant:

static void GetTableColumns(const ColumnDefinition &column, ColumnConstraintInfo constraint_info, DataChunk &output,
	                            idx_t index) {
		// return values:
		// "cid", PhysicalType::INT32
		output.SetValue(0, index, Value::INTEGER((int32_t)column.Oid()));
		// "name", PhysicalType::VARCHAR
		output.SetValue(1, index, Value(column.Name()));
		// "type", PhysicalType::VARCHAR
		output.SetValue(2, index, Value(column.Type().ToString()));
		// "notnull", PhysicalType::BOOL
		output.SetValue(3, index, Value::BOOLEAN(constraint_info.not_null));
		// "dflt_value", PhysicalType::VARCHAR
		output.SetValue(4, index, DefaultValue(column));
		// "pk", PhysicalType::BOOL
		output.SetValue(5, index, Value::BOOLEAN(constraint_info.pk));
	}